

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O0

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer *arg;
  cmMakefile *this;
  PolicyStatus PVar2;
  TargetType TVar3;
  ostream *poVar4;
  string *psVar5;
  pointer ppVar6;
  cmLocalGenerator *pcVar7;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmCompiledGeneratorExpression *this_00;
  char *pcVar8;
  pointer pbVar9;
  ulong uVar10;
  reference pbVar11;
  bool bVar12;
  byte local_513;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  cmLinkImplementation *local_458;
  cmLinkImplementation *li;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  iterator i_1;
  string end;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  string includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  byte local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  byte local_35a;
  allocator local_359;
  undefined1 local_358 [6];
  bool relpath;
  undefined1 local_338 [8];
  string evaluated;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_2e0 [8];
  cmGeneratorExpression ge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  cmGeneratorTarget *local_280;
  cmGeneratorTarget *gt;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  iterator i;
  string ldlibs;
  string sharedLibs;
  string staticLibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  _Self local_1e8;
  const_iterator pi;
  undefined1 local_1b0 [8];
  ostringstream w;
  bool newCMP0022Behavior;
  string *config_local;
  GenerateType type_local;
  ImportPropertyMap *properties_local;
  ostream *os_local;
  cmGeneratorTarget *target_local;
  
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
  bVar12 = false;
  if (PVar2 != WARN) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
    bVar12 = PVar2 != OLD;
  }
  if (!bVar12) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    if (type == BUILD) {
      std::operator<<((ostream *)local_1b0,
                      "export(TARGETS ... ANDROID_MK) called with policy CMP0022");
    }
    else {
      std::operator<<((ostream *)local_1b0,
                      "install( EXPORT_ANDROID_MK ...) called with policy CMP0022");
    }
    poVar4 = std::operator<<((ostream *)local_1b0," set to OLD for target ");
    psVar5 = cmTarget::GetName_abi_cxx11_(target->Target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,". ");
    std::operator<<(poVar4,"The export will only work with CMP0022 set to NEW.");
    this = target->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,(string *)&pi);
    std::__cxx11::string::~string((string *)&pi);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  }
  bVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::empty(properties);
  if (!bVar12) {
    std::operator<<(os,"LOCAL_CPP_FEATURES := rtti exceptions\n");
    local_1e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(properties);
    while( true ) {
      libraries.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::end(properties);
      bVar12 = std::operator!=(&local_1e8,
                               (_Self *)&libraries.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar12) break;
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_1e8);
      bVar12 = std::operator==(&ppVar6->first,"INTERFACE_COMPILE_OPTIONS");
      if (bVar12) {
        std::operator<<(os,"LOCAL_CPP_FEATURES += ");
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_1e8);
        poVar4 = std::operator<<(os,(string *)&ppVar6->second);
        std::operator<<(poVar4,"\n");
      }
      else {
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_1e8);
        bVar12 = std::operator==(&ppVar6->first,"INTERFACE_LINK_LIBRARIES");
        if (bVar12) {
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&staticLibs.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(pvVar1);
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_1e8);
          cmSystemTools::ExpandListArgument(&ppVar6->second,pvVar1,false);
          std::__cxx11::string::string((string *)(sharedLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(ldlibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&i);
          local_270._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&staticLibs.field_2 + 8));
          while( true ) {
            gt = (cmGeneratorTarget *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&staticLibs.field_2 + 8));
            bVar12 = __gnu_cxx::operator!=
                               (&local_270,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&gt);
            if (!bVar12) break;
            pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
            pbVar11 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_270);
            local_280 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar7,pbVar11);
            if (local_280 == (cmGeneratorTarget *)0x0) {
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
              cmGeneratorExpression::cmGeneratorExpression
                        ((cmGeneratorExpression *)local_2e0,(cmListFileBacktrace *)&cge);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_270);
              cmGeneratorExpression::Parse
                        ((cmGeneratorExpression *)((long)&evaluated.field_2 + 8),(string *)local_2e0
                        );
              r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                            ((auto_ptr *)(evaluated.field_2._M_local_buf + 8));
              ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffcf8,r);
              ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)
                         (evaluated.field_2._M_local_buf + 8));
              this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                                  ((auto_ptr<cmCompiledGeneratorExpression> *)
                                   &stack0xfffffffffffffcf8);
              pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
              std::__cxx11::string::string((string *)local_358);
              pcVar8 = cmCompiledGeneratorExpression::Evaluate
                                 (this_00,pcVar7,config,false,(cmGeneratorTarget *)0x0,
                                  (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                                  (string *)local_358);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)local_338,pcVar8,&local_359);
              std::allocator<char>::~allocator((allocator<char> *)&local_359);
              std::__cxx11::string::~string((string *)local_358);
              local_35a = 0;
              if (type == INSTALL) {
                pbVar9 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator->(&local_270);
                std::__cxx11::string::substr((ulong)&local_380,(ulong)pbVar9);
                local_35a = std::operator==(&local_380,"../");
                std::__cxx11::string::~string((string *)&local_380);
              }
              local_3a1 = 0;
              bVar12 = cmsys::SystemTools::FileIsFullPath((string *)local_338);
              local_513 = 1;
              if (!bVar12) {
                std::__cxx11::string::substr((ulong)&local_3a0,(ulong)local_338);
                local_3a1 = 1;
                bVar12 = std::operator==(&local_3a0,"-l");
                local_513 = 1;
                if (!bVar12) {
                  local_513 = local_35a;
                }
              }
              if ((local_3a1 & 1) != 0) {
                std::__cxx11::string::~string((string *)&local_3a0);
              }
              if ((local_513 & 1) == 0) {
                uVar10 = std::__cxx11::string::empty();
                if ((uVar10 & 1) == 0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&includes.field_2 + 8)," -l",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_338);
                  std::__cxx11::string::operator+=
                            ((string *)&i,(string *)(includes.field_2._M_local_buf + 8));
                  std::__cxx11::string::~string((string *)(includes.field_2._M_local_buf + 8));
                }
              }
              else {
                std::operator+(&local_3c8," ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_338);
                std::__cxx11::string::operator+=((string *)&i,(string *)&local_3c8);
                std::__cxx11::string::~string((string *)&local_3c8);
              }
              std::__cxx11::string::~string((string *)local_338);
              ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffcf8);
              cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_2e0);
            }
            else {
              TVar3 = cmGeneratorTarget::GetType(local_280);
              if ((TVar3 == SHARED_LIBRARY) ||
                 (TVar3 = cmGeneratorTarget::GetType(local_280), TVar3 == MODULE_LIBRARY)) {
                pbVar11 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_270);
                std::operator+(&local_2a0," ",pbVar11);
                std::__cxx11::string::operator+=
                          ((string *)(ldlibs.field_2._M_local_buf + 8),(string *)&local_2a0);
                std::__cxx11::string::~string((string *)&local_2a0);
              }
              else {
                pbVar11 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_270);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ge.Backtrace.Cur," ",pbVar11);
                std::__cxx11::string::operator+=
                          ((string *)(sharedLibs.field_2._M_local_buf + 8),
                           (string *)&ge.Backtrace.Cur);
                std::__cxx11::string::~string((string *)&ge.Backtrace.Cur);
              }
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_270);
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            poVar4 = std::operator<<(os,"LOCAL_SHARED_LIBRARIES :=");
            poVar4 = std::operator<<(poVar4,(string *)(ldlibs.field_2._M_local_buf + 8));
            std::operator<<(poVar4,"\n");
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            poVar4 = std::operator<<(os,"LOCAL_STATIC_LIBRARIES :=");
            poVar4 = std::operator<<(poVar4,(string *)(sharedLibs.field_2._M_local_buf + 8));
            std::operator<<(poVar4,"\n");
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            poVar4 = std::operator<<(os,"LOCAL_EXPORT_LDLIBS :=");
            poVar4 = std::operator<<(poVar4,(string *)&i);
            std::operator<<(poVar4,"\n");
          }
          std::__cxx11::string::~string((string *)&i);
          std::__cxx11::string::~string((string *)(ldlibs.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(sharedLibs.field_2._M_local_buf + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&staticLibs.field_2 + 8));
        }
        else {
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_1e8);
          bVar12 = std::operator==(&ppVar6->first,"INTERFACE_INCLUDE_DIRECTORIES");
          if (bVar12) {
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->(&local_1e8);
            arg = &includeList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::string((string *)arg,(string *)&ppVar6->second);
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&end.field_2 + 8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(pvVar1);
            cmSystemTools::ExpandListArgument((string *)arg,pvVar1,false);
            std::operator<<(os,"LOCAL_EXPORT_C_INCLUDES := ");
            std::__cxx11::string::string((string *)&i_1);
            local_448._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&end.field_2 + 8));
            while( true ) {
              li = (cmLinkImplementation *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&end.field_2 + 8));
              bVar12 = __gnu_cxx::operator!=
                                 (&local_448,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&li);
              if (!bVar12) break;
              poVar4 = std::operator<<(os,(string *)&i_1);
              pbVar11 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_448);
              std::operator<<(poVar4,(string *)pbVar11);
              std::__cxx11::string::operator=((string *)&i_1,"\\\n");
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_448);
            }
            std::operator<<(os,"\n");
            std::__cxx11::string::~string((string *)&i_1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&end.field_2 + 8));
            std::__cxx11::string::~string
                      ((string *)
                       &includeList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            poVar4 = std::operator<<(os,"# ");
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->(&local_1e8);
            poVar4 = std::operator<<(poVar4,(string *)ppVar6);
            poVar4 = std::operator<<(poVar4," ");
            ppVar6 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator->(&local_1e8);
            poVar4 = std::operator<<(poVar4,(string *)&ppVar6->second);
            std::operator<<(poVar4,"\n");
          }
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_1e8);
    }
  }
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == STATIC_LIBRARY) {
    local_458 = cmGeneratorTarget::GetLinkImplementation(target,config);
    local_468._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_458->Languages);
    local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&local_458->Languages);
    local_460 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[4]>
                          (local_468,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_470,(char (*) [4])0xba48f0);
    local_478._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_458->Languages);
    bVar12 = __gnu_cxx::operator!=(&local_460,&local_478);
    if (bVar12) {
      std::operator<<(os,"LOCAL_HAS_CPP := true\n");
    }
  }
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 != EXECUTABLE) {
    if (TVar3 == STATIC_LIBRARY) {
      std::operator<<(os,"include $(PREBUILT_STATIC_LIBRARY)\n");
    }
    else if (TVar3 - SHARED_LIBRARY < 2) {
      std::operator<<(os,"include $(PREBUILT_SHARED_LIBRARY)\n");
    }
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (ImportPropertyMap::const_iterator pi = properties.begin();
         pi != properties.end(); ++pi) {
      if (pi->first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (pi->second) << "\n";
      } else if (pi->first == "INTERFACE_LINK_LIBRARIES") {
        // need to look at list in pi->second and see if static or shared
        // FindTargetToLink
        // target->GetLocalGenerator()->FindGeneratorTargetToUse()
        // then add to LOCAL_CPPFLAGS
        std::vector<std::string> libraries;
        cmSystemTools::ExpandListArgument(pi->second, libraries);
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        for (std::vector<std::string>::iterator i = libraries.begin();
             i != libraries.end(); ++i) {
          cmGeneratorTarget* gt =
            target->GetLocalGenerator()->FindGeneratorTargetToUse(*i);
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + *i;
            } else {
              staticLibs += " " + *i;
            }
          } else {
            // evaluate any generator expressions with the current
            // build type of the makefile
            cmGeneratorExpression ge;
            CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
            std::string evaluated =
              cge->Evaluate(target->GetLocalGenerator(), config);
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = i->substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(evaluated) ||
                evaluated.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + evaluated;
              // if it is not a path and does not have a -l then add -l
            } else if (!evaluated.empty()) {
              ldlibs += " -l" + evaluated;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (pi->first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = pi->second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::vector<std::string>::iterator i = includeList.begin();
             i != includeList.end(); ++i) {
          os << end << *i;
          end = "\\\n";
        }
        os << "\n";
      } else {
        os << "# " << pi->first << " " << (pi->second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}